

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  void *pvVar10;
  _func_void *p_Var11;
  ulong uVar12;
  byte *pbVar13;
  char *zBuf;
  void **__dest;
  uint uVar14;
  char *local_68;
  void *local_48;
  ulong local_40;
  undefined8 local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_48 = (void *)0x0;
  iVar6 = sqlite3Strlen30(zFile);
  if (pzErrMsg == (char **)0x0) {
    if ((db->flags & 0x10000) != 0) goto LAB_0021874e;
  }
  else {
    *pzErrMsg = (char *)0x0;
    if ((db->flags & 0x10000) != 0) {
LAB_0021874e:
      local_40 = (ulong)(iVar6 + 300);
      local_68 = "sqlite3_extension_init";
      if (zProc != (char *)0x0) {
        local_68 = zProc;
      }
      local_38 = CONCAT44(extraout_var,iVar6);
      pvVar10 = (*psVar3->xDlOpen)(psVar3,zFile);
      bVar5 = true;
      while ((uVar12 = local_40, bVar5 && (pvVar10 == (void *)0x0))) {
        pcVar9 = sqlite3_mprintf("%s.%s",zFile,"so");
        if (pcVar9 == (char *)0x0) goto LAB_0021884d;
        pvVar10 = (*psVar3->xDlOpen)(psVar3,pcVar9);
        sqlite3_free(pcVar9);
        bVar5 = false;
      }
      if (pvVar10 == (void *)0x0) {
        if (pzErrMsg != (char **)0x0) {
          pcVar9 = (char *)sqlite3_malloc64(local_40);
          *pzErrMsg = pcVar9;
          if (pcVar9 != (char *)0x0) {
            sqlite3_snprintf((int)uVar12,pcVar9,"unable to open shared library [%s]",zFile);
            (*psVar3->xDlError)(psVar3,(int)local_38 + 299,pcVar9);
          }
          iVar6 = 1;
          goto LAB_00218a39;
        }
      }
      else {
        p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,local_68);
        if (zProc == (char *)0x0 && p_Var11 == (_func_void *)0x0) {
          uVar7 = sqlite3Strlen30(zFile);
          pcVar9 = (char *)sqlite3_malloc64((ulong)(uVar7 + 0x1e));
          if (pcVar9 == (char *)0x0) {
            (*psVar3->xDlClose)(psVar3,pvVar10);
LAB_0021884d:
            iVar6 = 7;
            goto LAB_00218a39;
          }
          builtin_strncpy(pcVar9,"sqlite3_",8);
          uVar12 = (ulong)uVar7;
          do {
            if ((long)uVar12 < 1) {
              uVar7 = 0;
              goto LAB_002188d3;
            }
            uVar1 = uVar12 - 1;
            lVar4 = uVar12 - 1;
            uVar12 = uVar1;
          } while (zFile[lVar4] != '/');
          uVar7 = (int)uVar1 + 1;
LAB_002188d3:
          iVar6 = sqlite3_strnicmp(zFile + uVar7,"lib",3);
          uVar14 = uVar7 + 3;
          if (iVar6 != 0) {
            uVar14 = uVar7;
          }
          pbVar13 = (byte *)(zFile + (int)uVar14);
          iVar6 = 8;
          while( true ) {
            bVar2 = *pbVar13;
            if ((bVar2 == 0) || (bVar2 == 0x2e)) break;
            if ((""[bVar2] & 2) != 0) {
              pcVar9[iVar6] = ""[(uint)(int)(char)bVar2];
              iVar6 = iVar6 + 1;
            }
            pbVar13 = pbVar13 + 1;
          }
          (pcVar9 + (long)iVar6 + 4)[0] = 't';
          (pcVar9 + (long)iVar6 + 4)[1] = '\0';
          builtin_strncpy(pcVar9 + iVar6,"_ini",4);
          p_Var11 = (*psVar3->xDlSym)(psVar3,pvVar10,pcVar9);
          local_68 = pcVar9;
        }
        else {
          pcVar9 = (char *)0x0;
        }
        if (p_Var11 == (_func_void *)0x0) {
          if (pzErrMsg != (char **)0x0) {
            iVar6 = sqlite3Strlen30(local_68);
            uVar7 = iVar6 + (int)local_40;
            zBuf = (char *)sqlite3_malloc64((ulong)uVar7);
            *pzErrMsg = zBuf;
            if (zBuf != (char *)0x0) {
              sqlite3_snprintf(uVar7,zBuf,"no entry point [%s] in shared library [%s]",local_68,
                               zFile);
              (*psVar3->xDlError)(psVar3,uVar7 - 1,zBuf);
            }
          }
          (*psVar3->xDlClose)(psVar3,pvVar10);
          sqlite3_free(pcVar9);
        }
        else {
          sqlite3_free(pcVar9);
          iVar8 = (*p_Var11)(db,&local_48,&sqlite3Apis);
          if (iVar8 == 0) {
            __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
            iVar6 = 7;
            if (__dest != (void **)0x0) {
              if (0 < (long)db->nExtension) {
                memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
              }
              sqlite3DbFree(db,db->aExtension);
              db->aExtension = __dest;
              iVar6 = db->nExtension;
              db->nExtension = iVar6 + 1;
              __dest[iVar6] = pvVar10;
              iVar6 = 0;
            }
            goto LAB_00218a39;
          }
          iVar6 = 0;
          if (iVar8 == 0x100) goto LAB_00218a39;
          if (pzErrMsg != (char **)0x0) {
            pcVar9 = sqlite3_mprintf("error during initialization: %s",local_48);
            *pzErrMsg = pcVar9;
          }
          sqlite3_free(local_48);
          (*psVar3->xDlClose)(psVar3,pvVar10);
        }
      }
      iVar6 = 1;
      goto LAB_00218a39;
    }
    pcVar9 = sqlite3_mprintf("not authorized");
    *pzErrMsg = pcVar9;
  }
  iVar6 = 1;
LAB_00218a39:
  iVar6 = sqlite3ApiExit(db,iVar6);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}